

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O0

void nn_xsub_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fq *self_00;
  nn_pipe *in_RSI;
  nn_fq_data *in_RDI;
  nn_xsub_data *data;
  nn_xsub *xsub;
  
  if (in_RDI == (nn_fq_data *)0x0) {
    in_RDI = (nn_fq_data *)0x0;
  }
  self_00 = (nn_fq *)nn_pipe_getdata(in_RSI);
  nn_fq_rm(self_00,in_RDI);
  nn_free((void *)0x1582ee);
  return;
}

Assistant:

static void nn_xsub_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsub *xsub;
    struct nn_xsub_data *data;

    xsub = nn_cont (self, struct nn_xsub, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_fq_rm (&xsub->fq, &data->fq);
    nn_free (data);
}